

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O3

void __thiscall XMISong::XMISong(XMISong *this,XMISong *original,char *filename,EMidiDevice type)

{
  int iVar1;
  int iVar2;
  BYTE *__src;
  TrackInfo *pTVar3;
  BYTE *__dest;
  TrackInfo *pTVar4;
  ulong uVar5;
  ulong uVar6;
  
  MIDIStreamer::MIDIStreamer(&this->super_MIDIStreamer,filename,type);
  (this->super_MIDIStreamer).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__XMISong_006f0728;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Array = (AutoNoteOff *)0x0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Most = 0;
  (this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>.Count = 0;
  iVar1 = original->SongLen;
  this->SongLen = iVar1;
  __dest = (BYTE *)operator_new__((long)iVar1);
  this->MusHeader = __dest;
  __src = original->MusHeader;
  memcpy(__dest,__src,(long)iVar1);
  iVar1 = original->NumSongs;
  uVar6 = (long)iVar1 << 7;
  this->NumSongs = iVar1;
  iVar2 = (original->super_MIDIStreamer).InitialTempo;
  (this->super_MIDIStreamer).InitialTempo = iVar2;
  (this->super_MIDIStreamer).Tempo = iVar2;
  uVar5 = 0xffffffffffffffff;
  if (-1 < (long)iVar1) {
    uVar5 = uVar6;
  }
  pTVar4 = (TrackInfo *)operator_new__(uVar5);
  this->Songs = pTVar4;
  if (0 < iVar1) {
    pTVar3 = original->Songs;
    uVar5 = 0;
    do {
      *(BYTE **)((long)pTVar4->ForLoops + (uVar5 - 0x38)) =
           __dest + (*(long *)((long)pTVar3->ForLoops + (uVar5 - 0x38)) - (long)__src);
      *(undefined8 *)((long)(pTVar4->ForLoops + -3) + uVar5) =
           *(undefined8 *)((long)(pTVar3->ForLoops + -3) + uVar5);
      *(undefined8 *)((long)pTVar4->ForLoops + (uVar5 - 0x28)) = 0;
      *(BYTE **)((long)(pTVar4->ForLoops + -2) + uVar5) =
           __dest + (*(long *)((long)(pTVar3->ForLoops + -2) + uVar5) - (long)__src);
      *(undefined8 *)((long)pTVar4->ForLoops + (uVar5 - 0x18)) =
           *(undefined8 *)((long)pTVar3->ForLoops + (uVar5 - 0x18));
      uVar5 = uVar5 + 0x80;
    } while (uVar6 != uVar5);
  }
  return;
}

Assistant:

XMISong::XMISong(const XMISong *original, const char *filename, EMidiDevice type)
: MIDIStreamer(filename, type)
{
	SongLen = original->SongLen;
	MusHeader = new BYTE[original->SongLen];
	memcpy(MusHeader, original->MusHeader, original->SongLen);
	NumSongs = original->NumSongs;
	Tempo = InitialTempo = original->InitialTempo;
	Songs = new TrackInfo[NumSongs];
	for (int i = 0; i < NumSongs; ++i)
	{
		TrackInfo *newtrack = &Songs[i];
		const TrackInfo *oldtrack = &original->Songs[i];

		newtrack->EventChunk = MusHeader + (oldtrack->EventChunk - original->MusHeader);
		newtrack->EventLen = oldtrack->EventLen;
		newtrack->EventP = 0;

		newtrack->TimbreChunk = MusHeader + (oldtrack->TimbreChunk - original->MusHeader);
		newtrack->TimbreLen = oldtrack->TimbreLen;
	}
}